

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageModule.cpp
# Opt level: O1

Message * __thiscall
ki::protocol::dml::MessageModule::create_message(MessageModule *this,string *message_name)

{
  pointer pcVar1;
  MessageTemplate *this_00;
  Message *pMVar2;
  ostream *poVar3;
  value_error *this_01;
  ostringstream oss;
  string local_1e0;
  string local_1c0;
  ostringstream local_1a0 [376];
  
  pcVar1 = (message_name->_M_dataplus)._M_p;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,pcVar1,pcVar1 + message_name->_M_string_length);
  this_00 = get_message_template(this,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if (this_00 != (MessageTemplate *)0x0) {
    pMVar2 = MessageTemplate::create_message(this_00);
    return pMVar2;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"No message exists with name: ",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,(message_name->_M_dataplus)._M_p,message_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"(service=",9);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(this->m_protocol_type)._M_dataplus._M_p,
                      (this->m_protocol_type)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  this_01 = (value_error *)__cxa_allocate_exception(0x18);
  std::__cxx11::stringbuf::str();
  value_error::value_error(this_01,&local_1c0,DML_INVALID_MESSAGE_NAME);
  __cxa_throw(this_01,&value_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Message *MessageModule::create_message(std::string message_name) const
	{
		auto *message_template = get_message_template(message_name);
		if (!message_template)
		{
			std::ostringstream oss;
			oss << "No message exists with name: " << message_name;
			oss << "(service=" << m_protocol_type << ")";
			throw value_error(oss.str(), value_error::DML_INVALID_MESSAGE_NAME);
		}

		return message_template->create_message();
	}